

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int64_t quicly_get_first_timeout(quicly_conn_t *conn)

{
  int iVar1;
  quicly_conn_t *conn_00;
  size_t sVar2;
  quicly_conn_t *in_RDI;
  int64_t at;
  uint64_t amp_window;
  quicly_conn_t *in_stack_ffffffffffffffd8;
  long local_20;
  long local_8;
  
  if ((in_RDI->super).state < QUICLY_STATE_CLOSING) {
    iVar1 = should_send_datagram_frame(in_RDI);
    if (iVar1 == 0) {
      conn_00 = (quicly_conn_t *)calc_amplification_limit_allowance(in_RDI);
      sVar2 = calc_send_window(in_RDI,0,(uint64_t)conn_00,0);
      if (sVar2 != 0) {
        if ((in_RDI->egress).pending_flows != '\0') {
          return 0;
        }
        iVar1 = quicly_linklist_is_linked(&(in_RDI->egress).pending_streams.control);
        if (iVar1 != 0) {
          return 0;
        }
        iVar1 = scheduler_can_send(in_stack_ffffffffffffffd8);
        if (iVar1 != 0) {
          return 0;
        }
      }
      local_20 = (in_RDI->idle_timeout).at;
      if (conn_00 != (quicly_conn_t *)0x0) {
        if (((in_RDI->egress).loss.alarm_at < local_20) &&
           (iVar1 = is_point5rtt_with_no_handshake_data_to_send(conn_00), iVar1 == 0)) {
          local_20 = (in_RDI->egress).loss.alarm_at;
        }
        if ((in_RDI->egress).send_ack_at < local_20) {
          local_20 = (in_RDI->egress).send_ack_at;
        }
      }
      local_8 = local_20;
    }
    else {
      local_8 = 0;
    }
  }
  else {
    local_8 = (in_RDI->egress).send_ack_at;
  }
  return local_8;
}

Assistant:

int64_t quicly_get_first_timeout(quicly_conn_t *conn)
{
    if (conn->super.state >= QUICLY_STATE_CLOSING)
        return conn->egress.send_ack_at;

    if (should_send_datagram_frame(conn))
        return 0;

    uint64_t amp_window = calc_amplification_limit_allowance(conn);

    if (calc_send_window(conn, 0, amp_window, 0) > 0) {
        if (conn->egress.pending_flows != 0)
            return 0;
        if (quicly_linklist_is_linked(&conn->egress.pending_streams.control))
            return 0;
        if (scheduler_can_send(conn))
            return 0;
    }

    /* if something can be sent, return the earliest timeout. Otherwise return the idle timeout. */
    int64_t at = conn->idle_timeout.at;
    if (amp_window > 0) {
        if (conn->egress.loss.alarm_at < at && !is_point5rtt_with_no_handshake_data_to_send(conn))
            at = conn->egress.loss.alarm_at;
        if (conn->egress.send_ack_at < at)
            at = conn->egress.send_ack_at;
    }

    return at;
}